

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsemaphore.cpp
# Opt level: O1

bool futexSemaphoreTryAcquire<QDeadlineTimer>
               (QBasicAtomicInteger<unsigned_long_long> *u,int n,QDeadlineTimer timeout)

{
  QDeadlineTimer timer;
  __int_type _Var1;
  __int_type _Var2;
  long in_FS_OFFSET;
  bool bVar3;
  bool bVar4;
  undefined1 local_50 [16];
  char *local_40;
  char *local_38;
  
  local_40 = timeout._8_8_;
  local_50._8_8_ = timeout.t1;
  local_38 = *(char **)(in_FS_OFFSET + 0x28);
  _Var2 = (u->_q_value).super___atomic_base<unsigned_long_long>._M_i;
  do {
    if ((int)_Var2 < n) {
      bVar3 = QDeadlineTimer::hasExpired((QDeadlineTimer *)(local_50 + 8));
      if (!bVar3) {
        bVar4 = (_Var2 & 0x7fffffff00000000) == 0x7fffffff00000000;
        bVar3 = !bVar4;
        if (bVar4) {
          QMessageLogger::critical((QMessageLogger *)local_50);
          QDebug::operator<<((QDebug *)local_50,"Waiter count overflow in QSemaphore");
          QDebug::~QDebug((QDebug *)local_50);
          goto LAB_003d2c99;
        }
        LOCK();
        (u->_q_value).super___atomic_base<unsigned_long_long>._M_i =
             (u->_q_value).super___atomic_base<unsigned_long_long>._M_i + 0x100000000;
        UNLOCK();
        timer._8_8_ = local_40;
        timer.t1 = local_50._8_8_;
        bVar4 = futexSemaphoreTryAcquire_loop<true>
                          (u,_Var2 + 0x100000000,(ulong)(uint)n * 0x100000001 + 0x100000000,timer);
        bVar3 = true;
        if (bVar4) goto LAB_003d2c99;
        LOCK();
        (u->_q_value).super___atomic_base<unsigned_long_long>._M_i =
             (u->_q_value).super___atomic_base<unsigned_long_long>._M_i - 0x100000000;
        UNLOCK();
      }
      bVar3 = false;
      goto LAB_003d2c99;
    }
    LOCK();
    _Var1 = (u->_q_value).super___atomic_base<unsigned_long_long>._M_i;
    bVar3 = _Var2 == _Var1;
    if (bVar3) {
      (u->_q_value).super___atomic_base<unsigned_long_long>._M_i =
           _Var2 + (ulong)(uint)n * -0x100000001;
      _Var1 = _Var2;
    }
    UNLOCK();
    _Var2 = _Var1;
  } while (!bVar3);
  bVar3 = true;
LAB_003d2c99:
  if (*(char **)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool
futexSemaphoreTryAcquire(QBasicAtomicInteger<quintptr> &u, int n, T timeout)
{
    constexpr bool IsTimed = std::is_same_v<QDeadlineTimer, T>;
    // Try to acquire without waiting (we still loop because the testAndSet
    // call can fail).
    quintptr nn = unsigned(n);
    if (futexHasWaiterCount)
        nn |= quint64(nn) << 32;    // token count replicated in high word

    quintptr curValue = u.loadAcquire();
    while (futexAvailCounter(curValue) >= n) {
        // try to acquire
        quintptr newValue = curValue - nn;
        if (u.testAndSetOrdered(curValue, newValue, curValue))
            return true;        // succeeded!
    }
    if constexpr (IsTimed) {
        if (timeout.hasExpired())
            return false;
    } else {
        if (timeout == Expired)
            return false;
    }

    // we need to wait
    constexpr quintptr oneWaiter = quintptr(Q_UINT64_C(1) << 32); // zero on 32-bit
    if constexpr (futexHasWaiterCount) {
        // We don't use the fetched value from above so futexWait() fails if
        // it changed after the testAndSetOrdered above.
        quint32 waiterCount = (quint64(curValue) >> 32) & 0x7fffffffU;
        if (waiterCount == 0x7fffffffU) {
            qCritical() << "Waiter count overflow in QSemaphore";
            return false;
        }

        // increase the waiter count
        u.fetchAndAddRelaxed(oneWaiter);
        curValue += oneWaiter;

        // Also adjust nn to subtract oneWaiter when we succeed in acquiring.
        nn += oneWaiter;
    }

    if (futexSemaphoreTryAcquire_loop<IsTimed>(u, curValue, nn, timeout))
        return true;

    Q_ASSERT(IsTimed);

    if (futexHasWaiterCount) {
        // decrement the number of threads waiting
        Q_ASSERT(futexHigh32(&u)->loadRelaxed() & 0x7fffffffU);
        u.fetchAndSubRelaxed(oneWaiter);
    }
    return false;
}